

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::MixtureIngredient::setDistributionSize
          (MixtureIngredient *this,double size_mean,double size_stddev,ChVector<double> *size_min,
          ChVector<double> *size_max)

{
  normal_distribution<double> *pnVar1;
  
  pnVar1 = (normal_distribution<double> *)::operator_new(0x20);
  (pnVar1->_M_param)._M_mean = size_mean;
  (pnVar1->_M_param)._M_stddev = size_stddev;
  pnVar1->_M_saved = 0.0;
  pnVar1->_M_saved_available = false;
  this->m_sizeDist = pnVar1;
  if (&this->m_minSize != size_min) {
    (this->m_minSize).m_data[0] = size_min->m_data[0];
    (this->m_minSize).m_data[1] = size_min->m_data[1];
    (this->m_minSize).m_data[2] = size_min->m_data[2];
  }
  if (&this->m_maxSize != size_max) {
    (this->m_maxSize).m_data[0] = size_max->m_data[0];
    (this->m_maxSize).m_data[1] = size_max->m_data[1];
    (this->m_maxSize).m_data[2] = size_max->m_data[2];
  }
  return;
}

Assistant:

void MixtureIngredient::setDistributionSize(double size_mean,
                                            double size_stddev,
                                            const ChVector<>& size_min,
                                            const ChVector<>& size_max) {
    m_sizeDist = new std::normal_distribution<double>(size_mean, size_stddev);
    m_minSize = size_min;
    m_maxSize = size_max;
}